

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O0

Value * __thiscall Kvm::expandClauses(Kvm *this,Value *clauses)

{
  bool bVar1;
  KatException *this_00;
  Value *pVVar2;
  undefined1 local_88 [8];
  GcGuard guard;
  Value *result2;
  Value *result1;
  allocator<char> local_51;
  string local_50;
  Value *local_30;
  Value *rest;
  Value *first;
  Value *clauses_local;
  Kvm *this_local;
  
  if (clauses == this->NIL) {
    this_local = (Kvm *)this->FALSE;
  }
  else {
    first = clauses;
    clauses_local = (Value *)this;
    rest = car(clauses);
    local_30 = cdr(first);
    bVar1 = isCondElseClause(this,rest);
    if (bVar1) {
      if (local_30 != this->NIL) {
        result1._3_1_ = 1;
        this_00 = (KatException *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"else clause isn\'t last",&local_51);
        anon_unknown.dwarf_ebf5::KatException::KatException(this_00,&local_50);
        result1._3_1_ = 0;
        __cxa_throw(this_00,&(anonymous_namespace)::KatException::typeinfo,
                    anon_unknown.dwarf_ebf5::KatException::~KatException);
      }
      pVVar2 = condActions(this,rest);
      this_local = (Kvm *)sequence(this,pVVar2);
    }
    else {
      result2 = (Value *)0x0;
      guard.times_ = 0;
      GcGuard::GcGuard((GcGuard *)local_88,&this->gc_);
      GcGuard::pushLocalStackRoot((GcGuard *)local_88,&result2);
      GcGuard::pushLocalStackRoot((GcGuard *)local_88,(Value **)&guard.times_);
      pVVar2 = condActions(this,rest);
      result2 = sequence(this,pVVar2);
      guard.times_ = (long)expandClauses(this,local_30);
      pVVar2 = condPredicate(this,rest);
      result2 = makeIf(this,pVVar2,result2,(Value *)guard.times_);
      this_local = (Kvm *)result2;
      GcGuard::~GcGuard((GcGuard *)local_88);
    }
  }
  return (Value *)this_local;
}

Assistant:

const Value* Kvm::expandClauses(const Value *clauses)
{
    if (clauses == NIL)
    {
        return FALSE;
    } else
    {
        auto first = car(clauses);
        auto rest  = cdr(clauses);
        if (isCondElseClause(first))
        {
            if (rest == NIL)
            {
                 return sequence(condActions(first));
            } else
            {
                throw KatException("else clause isn't last");
            }
        } else
        {
            const Value *result1 = nullptr;
            const Value *result2 = nullptr;
            GcGuard guard{gc_};
            guard.pushLocalStackRoot(&result1);
            guard.pushLocalStackRoot(&result2);

            result1 = sequence(condActions(first));
            result2 = expandClauses(rest);
            result1 = makeIf(condPredicate(first), result1, result2);
            return result1;
        }
    }
}